

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void listFiles(string *dirName,
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *f)

{
  bool bVar1;
  path local_60;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_60,dirName);
  bVar1 = std::experimental::filesystem::v1::is_directory(&local_60);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_60);
  if (bVar1) {
    _listFiles(dirName,f);
  }
  else {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(f,dirName);
  }
  return;
}

Assistant:

void listFiles(const std::string& dirName,
               const std::function<void(const std::string& path)>& f)
{
    if (!fs::is_directory(dirName)) {
        f(dirName);
        return;
    }
    _listFiles(dirName, f);
}